

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Follower.cpp
# Opt level: O0

void __thiscall
Follower::Follower(Follower *this,string *n,int t,int spT,int c,int at,int def,int hon,int bon,
                  int bc,string *txt)

{
  string local_48 [32];
  int local_28;
  int local_24;
  int at_local;
  int c_local;
  int spT_local;
  int t_local;
  string *n_local;
  Follower *this_local;
  
  local_28 = at;
  local_24 = c;
  at_local = spT;
  c_local = t;
  _spT_local = n;
  n_local = (string *)this;
  std::__cxx11::string::string(local_48,(string *)n);
  GreenCard::GreenCard(&this->super_GreenCard,(string *)local_48,c_local);
  std::__cxx11::string::~string(local_48);
  (this->super_GreenCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_0012b238;
  std::__cxx11::string::string((string *)&this->name);
  std::__cxx11::string::string((string *)&this->cardText);
  std::__cxx11::string::operator=((string *)&this->name,(string *)n);
  this->typeF = at_local;
  this->tapped = false;
  this->cost = local_24;
  this->attackBonus = local_28;
  this->defenseBonus = def;
  this->minimumHonor = hon;
  std::__cxx11::string::operator=((string *)&this->cardText,(string *)txt);
  this->effectBonus = bon;
  this->effectCost = bc;
  return;
}

Assistant:

Follower::Follower(string n, int t, int spT, int c, int at, int def, int hon, int bon, int bc, string txt) : GreenCard{n, t}
{
    name = n;
    typeF = Followers(spT);
    tapped = false;

    cost = c;
    attackBonus = at;
    defenseBonus = def;
    minimumHonor = hon;
    cardText = txt;

    effectBonus = bon;
    effectCost = bc;
}